

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_aux.c
# Opt level: O0

void luaL_openlib(lua_State *L,char *libname,luaL_Reg *l,int nup)

{
  undefined4 in_ECX;
  luaL_Reg *in_RDX;
  long in_RSI;
  lua_State *in_RDI;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  lua_State *in_stack_ffffffffffffffd0;
  int idx;
  undefined4 in_stack_ffffffffffffffe0;
  
  if (in_RSI != 0) {
    libsize(in_RDX);
    idx = (int)((ulong)in_RSI >> 0x20);
    luaL_pushmodule(in_RDI,(char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),0);
    lua_insert((lua_State *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),idx);
    in_stack_ffffffffffffffd0 = in_RDI;
  }
  if (in_RDX == (luaL_Reg *)0x0) {
    lua_settop(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  }
  else {
    luaL_setfuncs(in_stack_ffffffffffffffd0,
                  (luaL_Reg *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),0);
  }
  return;
}

Assistant:

LUALIB_API void luaL_openlib(lua_State *L, const char *libname,
			     const luaL_Reg *l, int nup)
{
  lj_lib_checkfpu(L);
  if (libname) {
    luaL_pushmodule(L, libname, libsize(l));
    lua_insert(L, -(nup + 1));  /* Move module table below upvalues. */
  }
  if (l)
    luaL_setfuncs(L, l, nup);
  else
    lua_pop(L, nup);  /* Remove upvalues. */
}